

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcSpfd.c
# Opt level: O1

int Bdc_SpfdHashValue(word t,int Size)

{
  uint uVar1;
  word *pwVar2;
  long lVar3;
  word t_local;
  
  pwVar2 = &t_local;
  t_local = t;
  lVar3 = 0;
  uVar1 = 0;
  do {
    uVar1 = uVar1 ^ (uint)(byte)*pwVar2 * *(int *)((long)If_CluHashKey::BigPrimes + lVar3);
    lVar3 = lVar3 + 4;
    pwVar2 = (word *)((long)pwVar2 + 1);
  } while (lVar3 != 0x20);
  return uVar1 % (uint)Size;
}

Assistant:

int Bdc_SpfdHashValue( word t, int Size )
{
    // http://planetmath.org/encyclopedia/GoodHashTablePrimes.html
    // 53,
    // 97,
    // 193,
    // 389,
    // 769,
    // 1543,
    // 3079,
    // 6151,
    // 12289,
    // 24593,
    // 49157,
    // 98317,
    // 196613,
    // 393241,
    // 786433,
    // 1572869,
    // 3145739,
    // 6291469,
    // 12582917,
    // 25165843,
    // 50331653,
    // 100663319,
    // 201326611,
    // 402653189,
    // 805306457,
    // 1610612741,
    static unsigned BigPrimes[8] = {12582917, 25165843, 50331653, 100663319, 201326611, 402653189, 805306457, 1610612741};
    unsigned char * s = (unsigned char *)&t;
    unsigned i, Value = 0;
    for ( i = 0; i < 8; i++ )
        Value ^= BigPrimes[i] * s[i];
    return Value % Size;
}